

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanCdataSection(ENCODING *UNUSED_enc,char *ptr,char *end,char **nextTokPtr)

{
  int local_34;
  int i;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *UNUSED_enc_local;
  
  if ((long)end - (long)ptr < 6) {
    UNUSED_enc_local._4_4_ = -1;
  }
  else {
    end_local = ptr;
    for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
      if (*end_local != "CDATA["[local_34]) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 1;
    }
    *nextTokPtr = end_local;
    UNUSED_enc_local._4_4_ = 8;
  }
  return UNUSED_enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(scanCdataSection)(const ENCODING *UNUSED_P(enc), const char *ptr,
                         const char *end, const char **nextTokPtr)
{
  static const char CDATA_LSQB[] = { ASCII_C, ASCII_D, ASCII_A,
                                     ASCII_T, ASCII_A, ASCII_LSQB };
  int i;
  /* CDATA[ */
  REQUIRE_CHARS(enc, ptr, end, 6);
  for (i = 0; i < 6; i++, ptr += MINBPC(enc)) {
    if (!CHAR_MATCHES(enc, ptr, CDATA_LSQB[i])) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_CDATA_SECT_OPEN;
}